

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

ProStringList * __thiscall
MakefileGenerator::findFilesInVPATH
          (ProStringList *__return_storage_ptr__,MakefileGenerator *this,ProStringList l,uchar flags
          ,QString *vpath_var)

{
  long lVar1;
  QString file;
  QString file_00;
  QString file_01;
  Data *pDVar2;
  Data *pDVar3;
  byte bVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  _List_node_base *this_00;
  pointer pPVar8;
  iterator this_01;
  iterator iVar9;
  qsizetype qVar10;
  pointer pQVar11;
  uint uVar12;
  ProString *pPVar13;
  undefined7 in_register_00000011;
  QArrayDataPointer<ProString> *other;
  byte bVar14;
  ulong uVar15;
  char16_t *pcVar16;
  long i;
  QString *in_R8;
  char16_t *pcVar17;
  ProString *pPVar18;
  long lVar19;
  ProString *this_02;
  long in_FS_OFFSET;
  undefined1 in_stack_fffffffffffffdc8 [15];
  int idx;
  QArrayDataPointer<char16_t> local_1e0;
  QArrayDataPointer<char16_t> local_1c8;
  QArrayDataPointer<char16_t> local_1b0;
  QArrayDataPointer<char16_t> local_198;
  QArrayDataPointer<char16_t> local_180;
  ProString local_168;
  QArrayDataPointer<ProString> local_138;
  QArrayDataPointer<ProString> local_118;
  QArrayDataPointer<ProString> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<ProString> local_88;
  ProString dir;
  
  other = (QArrayDataPointer<ProString> *)CONCAT71(in_register_00000011,flags);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d = (Data *)0x0;
  local_88.ptr = (ProString *)0x0;
  local_88.size = 0;
  this_00 = (this->project->super_QMakeEvaluator).m_valuemapStack.
            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
            ._M_impl._M_node.super__List_node_base._M_next + 1;
  uVar12 = (uint)vpath_var;
  bVar4 = (byte)(((ulong)vpath_var & 0xffffffff) >> 1) & 0x7f;
  idx = 0;
  do {
    do {
      i = (long)idx;
      if (other->size <= i) {
        QArrayDataPointer<ProString>::QArrayDataPointer
                  ((QArrayDataPointer<ProString> *)__return_storage_ptr__,other);
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return __return_storage_ptr__;
      }
      pPVar8 = QList<ProString>::data((QList<ProString> *)other);
      if (pPVar8[i].m_length == 0) goto LAB_00140088;
      this_02 = pPVar8 + i;
      local_a8.size = -0x5555555555555556;
      local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_a8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)&local_a8,this_02);
      local_c8.size = -0x5555555555555556;
      local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      fixEnvVariables((QString *)&local_c8,(QString *)&local_a8);
      if (local_c8.size == 0) {
LAB_0013f5b7:
        idx = idx + 1;
        bVar14 = 0;
        bVar5 = false;
      }
      else {
        if ((uVar12 & 4) == 0) {
          fileFixify(&dir.m_string,this,(QString *)&local_c8,(FileFixifyTypes)0x3,true);
          qVar10 = local_c8.size;
          pcVar16 = local_c8.ptr;
          pDVar2 = local_c8.d;
          local_c8.d = dir.m_string.d.d;
          local_c8.ptr = dir.m_string.d.ptr;
          dir.m_string.d.d = pDVar2;
          dir.m_string.d.ptr = pcVar16;
          local_c8.size = dir.m_string.d.size;
          dir.m_string.d.size = qVar10;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
        }
        local_e0.d = local_c8.d;
        local_e0.ptr = local_c8.ptr;
        local_e0.size = local_c8.size;
        if (local_c8.d != (Data *)0x0) {
          LOCK();
          ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        file.d.ptr._7_1_ = bVar4;
        file.d._0_15_ = in_stack_fffffffffffffdc8;
        file.d.size._0_4_ = idx;
        file.d.size._4_4_ = uVar12;
        bVar5 = exists(this,file);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
        if (bVar5) goto LAB_0013f5b7;
        cVar6 = QDir::isRelativePath((QString *)&local_a8);
        if (cVar6 == '\0') {
LAB_0013f9ad:
          local_168.m_string.d.size = 0;
          local_168.m_string.d.d = (Data *)0x0;
          local_168.m_string.d.ptr = (char16_t *)0x0;
          local_f8.size = -0x5555555555555556;
          local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_f8.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
          ProString::toQString((QString *)&local_f8,this_02);
          local_118.d = (Data *)0x0;
          local_118.ptr = (ProString *)0x0;
          local_118.size = 0;
          qVar10 = QString::lastIndexOf((QString *)&local_f8,&Option::dir_sep,CaseSensitive);
          bVar14 = bVar4;
          if (qVar10 != -1) {
            qVar10 = QString::lastIndexOf((QString *)&local_f8,&Option::dir_sep,CaseSensitive);
            QString::left(&dir.m_string,(QString *)&local_f8,qVar10 + 1);
            qVar10 = local_168.m_string.d.size;
            pcVar16 = local_168.m_string.d.ptr;
            pDVar2 = local_168.m_string.d.d;
            local_168.m_string.d.d = dir.m_string.d.d;
            local_168.m_string.d.ptr = dir.m_string.d.ptr;
            dir.m_string.d.d = pDVar2;
            dir.m_string.d.ptr = pcVar16;
            local_168.m_string.d.size = dir.m_string.d.size;
            dir.m_string.d.size = qVar10;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
            QString::operator=((QString *)&local_118,(QString *)&local_168);
            bVar14 = bVar4;
            if ((uVar12 & 4) == 0) {
              fileFixify((QString *)&local_198,this,(QString *)&local_118,(FileFixifyTypes)0x3,true)
              ;
              dir.m_string.d.size = local_198.size;
              dir.m_string.d.ptr = local_198.ptr;
              dir.m_string.d.d = local_198.d;
              local_198.d = (Data *)0x0;
              local_198.ptr = (char16_t *)0x0;
              local_198.size = 0;
              dir.m_offset._0_1_ = 0x2f;
              QStringBuilder<QString,_char>::convertTo<QString>
                        ((QString *)&local_138,(QStringBuilder<QString,_char> *)&dir);
              qVar10 = local_118.size;
              pPVar18 = local_118.ptr;
              pDVar3 = local_118.d;
              local_118.d = local_138.d;
              local_118.ptr = local_138.ptr;
              local_138.d = pDVar3;
              local_138.ptr = pPVar18;
              local_118.size = local_138.size;
              local_138.size = qVar10;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_138);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
              bVar14 = bVar4;
            }
            QString::remove((longlong)&local_f8,0);
          }
          bVar4 = bVar14;
          if (local_118.size == 0) {
LAB_0013fc02:
            local_138.size = 0xaaaaaaaaaaaaaaaa;
            local_138.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_138.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
            QDir::QDir((QDir *)&local_198,(QString *)&local_118);
            QList<QString>::QList<QString,void>((QList<QString> *)&dir,(QString *)&local_f8);
            QDir::entryList(&local_138,&local_198,&dir,0x6007,0xffffffffffffffff);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&dir);
            QDir::~QDir((QDir *)&local_198);
            if (local_138.size == 0) {
              bVar14 = bVar4;
              if (Option::debug_level != 0) {
                ProString::toLatin1((QByteArray *)&dir,this_02);
                pcVar16 = dir.m_string.d.ptr;
                if (dir.m_string.d.ptr == (char16_t *)0x0) {
                  pcVar16 = (char16_t *)&QByteArray::_empty;
                }
                QString::QString((QString *)&local_1e0,"::");
                ProStringList::join((QString *)&local_1c8,(ProStringList *)&local_88,
                                    (QString *)&local_1e0);
                QString::toLatin1_helper_inplace((QString *)&local_198);
                pcVar17 = local_198.ptr;
                if (local_198.ptr == (char16_t *)0x0) {
                  pcVar17 = (char16_t *)&QByteArray::_empty;
                }
                debug_msg_internal(1,"makefile.cpp:%d Failure to find %s in vpath (%s)",0x12a,
                                   pcVar16,pcVar17);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_198);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
                bVar14 = bVar4;
              }
              bVar4 = bVar14;
              if ((uVar12 & 1) != 0) {
                ProString::toLatin1((QByteArray *)&dir,this_02);
                pcVar16 = dir.m_string.d.ptr;
                if (dir.m_string.d.ptr == (char16_t *)0x0) {
                  pcVar16 = (char16_t *)&QByteArray::_empty;
                }
                warn_msg(WarnLogic,"Failure to find: %s",pcVar16);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
                bVar4 = bVar14;
              }
            }
            else {
              ProStringList::removeAt((ProStringList *)other,idx);
              local_198.d = (Data *)0x0;
              local_198.ptr = (char16_t *)0x0;
              local_198.size = 0;
              uVar15 = local_138.size;
              lVar19 = (local_138.size & 0xffffffffU) * 0x18;
              while( true ) {
                if ((int)uVar15 < 1) break;
                pQVar11 = QList<QString>::data((QList<QString> *)&local_138);
                local_1c8.ptr = (char16_t *)((long)&pQVar11[-1].d.d + lVar19);
                local_1c8.d = (Data *)&local_118;
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          (&dir.m_string,(QStringBuilder<QString_&,_QString_&> *)&local_1c8);
                qVar10 = local_198.size;
                pcVar16 = local_198.ptr;
                pDVar2 = local_198.d;
                local_198.d = dir.m_string.d.d;
                local_198.ptr = dir.m_string.d.ptr;
                dir.m_string.d.d = pDVar2;
                dir.m_string.d.ptr = pcVar16;
                local_198.size = dir.m_string.d.size;
                dir.m_string.d.size = qVar10;
                QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir)
                ;
                if ((uVar12 & 4) == 0) {
                  fileFixify(&dir.m_string,this,(QString *)&local_198,(FileFixifyTypes)0x0,true);
                  qVar10 = local_198.size;
                  pcVar16 = local_198.ptr;
                  pDVar2 = local_198.d;
                  local_198.d = dir.m_string.d.d;
                  local_198.ptr = dir.m_string.d.ptr;
                  dir.m_string.d.d = pDVar2;
                  dir.m_string.d.ptr = pcVar16;
                  local_198.size = dir.m_string.d.size;
                  dir.m_string.d.size = qVar10;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&dir);
                }
                ProString::ProString(&dir,(QString *)&local_198);
                QList<ProString>::emplace<ProString>((QList<ProString> *)other,i,&dir);
                QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir)
                ;
                uVar15 = (ulong)((int)uVar15 - 1);
                lVar19 = lVar19 + -0x18;
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
              bVar14 = 0;
            }
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_138)
            ;
          }
          else {
            local_1b0.d = (Data *)local_118.d;
            local_1b0.ptr = (char16_t *)local_118.ptr;
            local_1b0.size = local_118.size;
            if (local_118.d != (Data *)0x0) {
              LOCK();
              ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            file_01.d.ptr._7_1_ = bVar14;
            file_01.d._0_15_ = in_stack_fffffffffffffdc8;
            file_01.d.size._0_4_ = idx;
            file_01.d.size._4_4_ = uVar12;
            bVar5 = exists(this,file_01);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
            bVar4 = bVar14;
            if (bVar5) goto LAB_0013fc02;
            if (Option::debug_level != 0) {
              QString::toLatin1_helper((QString *)&dir);
              pcVar16 = dir.m_string.d.ptr;
              if (dir.m_string.d.ptr == (char16_t *)0x0) {
                pcVar16 = (char16_t *)&QByteArray::_empty;
              }
              QString::toLatin1_helper((QString *)&local_138);
              pPVar18 = local_138.ptr;
              if (local_138.ptr == (ProString *)0x0) {
                pPVar18 = (ProString *)&QByteArray::_empty;
              }
              QString::toLatin1_helper((QString *)&local_198);
              pcVar17 = local_198.ptr;
              if (local_198.ptr == (char16_t *)0x0) {
                pcVar17 = (char16_t *)&QByteArray::_empty;
              }
              debug_msg_internal(1,"makefile.cpp:%d Cannot match %s%s, as %s does not exist.",0x13c,
                                 pcVar16,pPVar18,pcVar17);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_198);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_138);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
            }
            bVar4 = bVar14;
            if ((uVar12 & 1) != 0) {
              ProString::toLatin1((QByteArray *)&dir,this_02);
              pcVar16 = dir.m_string.d.ptr;
              if (dir.m_string.d.ptr == (char16_t *)0x0) {
                pcVar16 = (char16_t *)&QByteArray::_empty;
              }
              warn_msg(WarnLogic,"Failure to find: %s",pcVar16);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
              bVar4 = bVar14;
            }
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168)
          ;
          bVar5 = true;
        }
        else {
          if (local_88.size == 0) {
            if ((in_R8->d).size != 0) {
              ProKey::ProKey((ProKey *)&dir,in_R8);
              QMap<ProKey,_ProStringList>::operator[]
                        ((ProStringList *)&local_168,(QMap<ProKey,_ProStringList> *)this_00,
                         (ProKey *)&dir);
              QArrayDataPointer<ProString>::operator=
                        (&local_88,(QArrayDataPointer<ProString> *)&local_168);
              QArrayDataPointer<ProString>::~QArrayDataPointer
                        ((QArrayDataPointer<ProString> *)&local_168);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
            }
            ProKey::ProKey((ProKey *)&dir,"VPATH");
            QMap<ProKey,_ProStringList>::operator[]
                      ((ProStringList *)&local_118,(QMap<ProKey,_ProStringList> *)this_00,
                       (ProKey *)&dir);
            ProKey::ProKey((ProKey *)&local_168,"QMAKE_ABSOLUTE_SOURCE_PATH");
            QMap<ProKey,_ProStringList>::operator[]
                      ((ProStringList *)&local_138,(QMap<ProKey,_ProStringList> *)this_00,
                       (ProKey *)&local_168);
            operator+((ProStringList *)&local_f8,(ProStringList *)&local_118,
                      (ProStringList *)&local_138);
            QList<ProString>::append((QList<ProString> *)&local_88,(QList<ProString> *)&local_f8);
            QArrayDataPointer<ProString>::~QArrayDataPointer(&local_f8);
            QArrayDataPointer<ProString>::~QArrayDataPointer(&local_138);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_168);
            QArrayDataPointer<ProString>::~QArrayDataPointer(&local_118);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
            qmake_getpwd();
            bVar5 = operator!=(&Option::output_dir,&dir.m_string);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
            if (bVar5) {
              ProString::ProString(&dir,&Option::output_dir);
              QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_88,&dir);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
            }
          }
          this_01 = QList<ProString>::begin((QList<ProString> *)&local_88);
          bVar5 = false;
          do {
            iVar9 = QList<ProString>::end((QList<ProString> *)&local_88);
            if (this_01.i == iVar9.i) break;
            local_f8.size = -0x5555555555555556;
            local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_f8.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
            ProString::toQString(&dir.m_string,this_01.i);
            Option::normalizePath((QString *)&local_f8,&dir.m_string,true,true);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
            dir.m_string.d.ptr = (char16_t *)CONCAT71(dir.m_string.d.ptr._1_7_,0x2f);
            dir.m_string.d.d = (Data *)&local_f8;
            dir.m_string.d.size = (qsizetype)this_02;
            QStringBuilder<QStringBuilder<QString_&,_char>,_ProString_&>::convertTo<QString>
                      ((QString *)&local_180,
                       (QStringBuilder<QStringBuilder<QString_&,_char>,_ProString_&> *)&dir);
            file_00.d.ptr._7_1_ = bVar4;
            file_00.d._0_15_ = in_stack_fffffffffffffdc8;
            file_00.d.size._0_4_ = idx;
            file_00.d.size._4_4_ = uVar12;
            bVar7 = exists(this,file_00);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_180);
            if (bVar7) {
              dir.m_file = -0x55555556;
              dir._36_4_ = 0xaaaaaaaa;
              dir.m_hash = 0xaaaaaaaaaaaaaaaa;
              dir.m_string.d.size = -0x5555555555555556;
              dir.m_offset = -0x55555556;
              dir.m_length = -0x55555556;
              dir.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              dir.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              ProString::ProString(&dir,this_01.i);
              bVar5 = ProString::endsWith(&dir,&Option::dir_sep,CaseSensitive);
              if (!bVar5) {
                ProString::append(&dir,&Option::dir_sep);
              }
              local_168.m_string.d.d = (Data *)&dir;
              local_168.m_string.d.ptr = (char16_t *)this_02;
              ProString::operator=(this_02,(QStringBuilder<ProString_&,_ProString_&> *)&local_168);
              if ((uVar12 & 4) == 0) {
                ProString::toQString((QString *)&local_138,this_02);
                fileFixify((QString *)&local_118,this,(QString *)&local_138,(FileFixifyTypes)0x0,
                           true);
                ProString::ProString(&local_168,(QString *)&local_118);
                ProString::operator=(this_02,&local_168);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_168);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_118);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_138);
              }
              if (Option::debug_level != 0) {
                QString::toLatin1_helper((QString *)&local_168);
                pPVar18 = (ProString *)local_168.m_string.d.ptr;
                if ((ProString *)local_168.m_string.d.ptr == (ProString *)0x0) {
                  pPVar18 = (ProString *)&QByteArray::_empty;
                }
                ProString::toLatin1((QByteArray *)&local_118,this_02);
                pPVar13 = local_118.ptr;
                if (local_118.ptr == (ProString *)0x0) {
                  pPVar13 = (ProString *)&QByteArray::_empty;
                }
                debug_msg_internal(1,"Found file through vpath %s -> %s",pPVar18,pPVar13);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_118);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_168);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
              bVar5 = true;
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_f8);
            this_01.i = this_01.i + 1;
          } while (!bVar7);
          if (!bVar5) goto LAB_0013f9ad;
          bVar5 = true;
          bVar14 = 0;
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    } while (!bVar5);
    if ((bVar14 & 1) == 0) {
LAB_00140088:
      idx = idx + 1;
    }
    else {
      ProStringList::removeAt((ProStringList *)other,idx);
    }
  } while( true );
}

Assistant:

ProStringList
MakefileGenerator::findFilesInVPATH(ProStringList l, uchar flags, const QString &vpath_var)
{
    ProStringList vpath;
    const ProValueMap &v = project->variables();
    for(int val_it = 0; val_it < l.size(); ) {
        bool remove_file = false;
        ProString &val = l[val_it];
        if(!val.isEmpty()) {
            QString qval = val.toQString();
            QString file = fixEnvVariables(qval);
            if (file.isEmpty()) {
                ++val_it;
                continue;
            }
            if(!(flags & VPATH_NoFixify))
                file = fileFixify(file, FileFixifyBackwards);

            if(exists(file)) {
                ++val_it;
                continue;
            }
            bool found = false;
            if (QDir::isRelativePath(qval)) {
                if(vpath.isEmpty()) {
                    if(!vpath_var.isEmpty())
                        vpath = v[ProKey(vpath_var)];
                    vpath += v["VPATH"] + v["QMAKE_ABSOLUTE_SOURCE_PATH"];
                    if(Option::output_dir != qmake_getpwd())
                        vpath << Option::output_dir;
                }
                for (ProStringList::Iterator vpath_it = vpath.begin();
                    vpath_it != vpath.end(); ++vpath_it) {
                    QString real_dir = Option::normalizePath((*vpath_it).toQString());
                    if (exists(real_dir + '/' + val)) {
                        ProString dir = (*vpath_it);
                        if(!dir.endsWith(Option::dir_sep))
                            dir += Option::dir_sep;
                        val = dir + val;
                        if(!(flags & VPATH_NoFixify))
                            val = fileFixify(val.toQString());
                        found = true;
                        debug_msg(1, "Found file through vpath %s -> %s",
                                  file.toLatin1().constData(), val.toLatin1().constData());
                        break;
                    }
                }
            }
            if(!found) {
                QString dir, regex = val.toQString(), real_dir;
                if(regex.lastIndexOf(Option::dir_sep) != -1) {
                    dir = regex.left(regex.lastIndexOf(Option::dir_sep) + 1);
                    real_dir = dir;
                    if(!(flags & VPATH_NoFixify))
                        real_dir = fileFixify(real_dir, FileFixifyBackwards) + '/';
                    regex.remove(0, dir.size());
                }
                if(real_dir.isEmpty() || exists(real_dir)) {
                    QStringList files = QDir(real_dir).entryList(QStringList(regex),
                                                QDir::NoDotAndDotDot | QDir::AllEntries);
                    if(files.isEmpty()) {
                        debug_msg(1, "makefile.cpp:%d Failure to find %s in vpath (%s)",
                                  __LINE__, val.toLatin1().constData(),
                                  vpath.join(QString("::")).toLatin1().constData());
                        if (flags & VPATH_RemoveMissingFiles)
                            remove_file = true;
                        if (flags & VPATH_WarnMissingFiles)
                            warn_msg(WarnLogic, "Failure to find: %s", val.toLatin1().constData());
                    } else {
                        l.removeAt(val_it);
                        QString a;
                        for(int i = (int)files.size()-1; i >= 0; i--) {
                            a = real_dir + files[i];
                            if(!(flags & VPATH_NoFixify))
                                a = fileFixify(a);
                            l.insert(val_it, a);
                        }
                    }
                } else {
                    debug_msg(1, "makefile.cpp:%d Cannot match %s%s, as %s does not exist.",
                              __LINE__, real_dir.toLatin1().constData(),
                              regex.toLatin1().constData(), real_dir.toLatin1().constData());
                    if (flags & VPATH_RemoveMissingFiles)
                        remove_file = true;
                    if (flags & VPATH_WarnMissingFiles)
                        warn_msg(WarnLogic, "Failure to find: %s", val.toLatin1().constData());
                }
            }
        }
        if(remove_file)
            l.removeAt(val_it);
        else
            ++val_it;
    }
    return l;
}